

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O2

size_t ptls_asn1_validation_recursive
                 (uint8_t *bytes,size_t bytes_max,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  int level_00;
  size_t sVar1;
  ulong byte_index;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  int indefinite_length;
  size_t local_60;
  ulong local_58;
  uint32_t type_number;
  int type_class;
  int structure_bit;
  size_t last_byte;
  uint32_t local_34;
  
  structure_bit = 0;
  type_class = 0;
  type_number = 0;
  indefinite_length = 0;
  last_byte = 0;
  local_60 = bytes_max;
  sVar1 = ptls_asn1_read_type(bytes,bytes_max,&structure_bit,&type_class,&type_number,decode_error,
                              level,log_ctx);
  if ((log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) && (*decode_error == 0)) {
    ptls_asn1_print_type(type_class,type_number,level,log_ctx);
  }
  sVar2 = local_60;
  local_58 = (ulong)(uint)level;
  byte_index = ptls_asn1_read_length
                         (bytes,local_60,sVar1,&local_34,&indefinite_length,&last_byte,decode_error,
                          level,log_ctx);
  sVar1 = last_byte;
  if (last_byte <= sVar2) {
    if (structure_bit == 0) {
      ptls_asn1_dump_content(bytes,last_byte,byte_index,log_ctx);
      byte_index = sVar1;
    }
    else {
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
        (*log_ctx->fn)(log_ctx->ctx," {\n");
      }
      iVar3 = indefinite_length;
      level_00 = (int)local_58 + 1;
      while (sVar2 = local_60, uVar4 = byte_index, byte_index <= sVar1 && sVar1 - byte_index != 0) {
        if ((iVar3 != 0) && (bytes[byte_index] == '\0')) {
          uVar4 = byte_index + 2;
          if ((uVar4 <= local_60) && (bytes[byte_index + 1] == '\0')) {
            if (log_ctx == (ptls_minicrypto_log_ctx_t *)0x0) {
              return uVar4;
            }
            iVar3 = (int)local_58;
            ptls_asn1_print_indent(iVar3,log_ctx);
            (*log_ctx->fn)(log_ctx->ctx,"EOC\n");
            goto LAB_0010f98d;
          }
          ptls_asn1_error_message
                    ("EOC: unexpected end of content",local_60,byte_index,level_00,log_ctx);
          *decode_error = 0x239;
          uVar4 = sVar2;
          break;
        }
        sVar2 = ptls_asn1_validation_recursive
                          (bytes + byte_index,sVar1 - byte_index,decode_error,level_00,log_ctx);
        uVar4 = local_60;
        if (*decode_error != 0) break;
        byte_index = byte_index + sVar2;
        if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
          if (byte_index < sVar1) {
            (*log_ctx->fn)(log_ctx->ctx,",");
          }
          (*log_ctx->fn)(log_ctx->ctx,"\n");
        }
      }
      iVar3 = (int)local_58;
      byte_index = uVar4;
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
LAB_0010f98d:
        ptls_asn1_print_indent(iVar3,log_ctx);
        (*log_ctx->fn)(log_ctx->ctx,"}");
        byte_index = uVar4;
      }
    }
  }
  return byte_index;
}

Assistant:

size_t ptls_asn1_validation_recursive(const uint8_t *bytes, size_t bytes_max, int *decode_error, int level,
                                      ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    int structure_bit = 0;
    int type_class = 0;
    uint32_t type_number = 0;
    uint32_t length = 0;
    int indefinite_length = 0;
    size_t last_byte = 0;
    /* Decode the type */
    size_t byte_index =
        ptls_asn1_read_type(bytes, bytes_max, &structure_bit, &type_class, &type_number, decode_error, level, log_ctx);

    if (*decode_error == 0 && log_ctx != NULL) {
        ptls_asn1_print_type(type_class, type_number, level, log_ctx);
    }

    /* Get the length */
    byte_index =
        ptls_asn1_read_length(bytes, bytes_max, byte_index, &length, &indefinite_length, &last_byte, decode_error, level, log_ctx);

    if (last_byte <= bytes_max) {
        if (structure_bit) {
            /* If structured, recurse on a loop */
            if (log_ctx != NULL) {
                log_ctx->fn(log_ctx->ctx, " {\n");
            }

            while (byte_index < last_byte) {
                if (indefinite_length != 0 && bytes[byte_index] == 0) {
                    if (byte_index + 2 > bytes_max || bytes[byte_index + 1] != 0) {
                        byte_index =
                            ptls_asn1_error_message("EOC: unexpected end of content", bytes_max, byte_index, level + 1, log_ctx);

                        *decode_error = PTLS_ERROR_BER_UNEXPECTED_EOC;
                        byte_index = bytes_max;
                        break;
                    } else {
                        if (log_ctx != NULL) {
                            ptls_asn1_print_indent(level, log_ctx);
                            log_ctx->fn(log_ctx->ctx, "EOC\n");
                        }
                        byte_index += 2;
                        break;
                    }
                } else {
                    byte_index += ptls_asn1_validation_recursive(bytes + byte_index, last_byte - byte_index, decode_error,
                                                                 level + 1, log_ctx);

                    if (*decode_error) {
                        byte_index = bytes_max;
                        break;
                    }
                }

                if (log_ctx != NULL) {
                    if (byte_index < last_byte) {
                        log_ctx->fn(log_ctx->ctx, ",");
                    }
                    log_ctx->fn(log_ctx->ctx, "\n");
                }
            }

            if (log_ctx != NULL) {
                ptls_asn1_print_indent(level, log_ctx);
                log_ctx->fn(log_ctx->ctx, "}");
            }
        } else {
            ptls_asn1_dump_content(bytes, last_byte, byte_index, log_ctx);
            byte_index = last_byte;
        }
    }

    return byte_index;
}